

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O2

int is_constant(double *x,int N)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  dVar4 = macheps();
  lVar3 = 1;
  do {
    if (N <= lVar3) {
      return 1;
    }
    pdVar1 = x + lVar3;
    lVar2 = lVar3 + -1;
    lVar3 = lVar3 + 1;
  } while (ABS(*pdVar1 - x[lVar2]) <= dVar4);
  return 0;
}

Assistant:

int is_constant(double *x, int N) {
    int i, cst;
    double eps,tmp;

    eps = macheps();
    cst = 1;

    for(i = 1; i < N;++i) {
        tmp = x[i] - x[i-1];
        if (fabs(tmp) > eps) {
            return 0;
        }
    }

    return cst;
}